

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O3

int is_end_of_bre_subexp(OnigUChar *p,OnigUChar *end,OnigEncoding enc,ParseEnv *env)

{
  OnigCodePoint OVar1;
  int iVar2;
  
  iVar2 = 1;
  if (p != end) {
    OVar1 = (*enc->mbc_to_code)(p,end);
    if ((OVar1 == (env->syntax->meta_char_table).esc) && ((env->syntax->op2 & 0x100000) == 0)) {
      iVar2 = (*enc->mbc_enc_len)(p);
      if (p + iVar2 < end) {
        OVar1 = (*enc->mbc_to_code)(p + iVar2,end);
        if (OVar1 == 0x29) {
          return 1;
        }
        if ((OVar1 == 0x7c) && ((env->syntax->op & 0x800) != 0)) {
          return 1;
        }
      }
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
is_end_of_bre_subexp(UChar* p, UChar* end, OnigEncoding enc, ParseEnv* env)
{
  OnigCodePoint code;

  if (p == end) return TRUE;

  code = ONIGENC_MBC_TO_CODE(enc, p, end);
  if (IS_MC_ESC_CODE(code, env->syntax)) {
    p += ONIGENC_MBC_ENC_LEN(enc, p);
    if (p < end) {
      code = ONIGENC_MBC_TO_CODE(enc, p, end);
      if (code == ')' ||
          (code == '|' &&
           IS_SYNTAX_OP(env->syntax, ONIG_SYN_OP_ESC_VBAR_ALT)))
        return TRUE;
    }
  }

  return FALSE;
}